

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void pop_scope(JSParseState *s)

{
  JSFunctionDef *pJVar1;
  JSVarScope *pJVar2;
  uint uVar3;
  int iVar4;
  JSFunctionDef *fd;
  undefined2 local_1a;
  
  pJVar1 = s->cur_func;
  if (pJVar1 != (JSFunctionDef *)0x0) {
    iVar4 = pJVar1->scope_level;
    emit_op(s,0xb3);
    local_1a = (undefined2)iVar4;
    dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_1a,2);
    pJVar2 = pJVar1->scopes;
    uVar3 = pJVar2[iVar4].parent;
    pJVar1->scope_level = uVar3;
    for (; -1 < (int)uVar3; uVar3 = pJVar2[uVar3].parent) {
      iVar4 = pJVar2[uVar3].first;
      if (-1 < iVar4) goto LAB_0015a543;
    }
    iVar4 = -1;
LAB_0015a543:
    pJVar1->scope_first = iVar4;
  }
  return;
}

Assistant:

static void pop_scope(JSParseState *s) {
    if (s->cur_func) {
        /* disable scoped variables */
        JSFunctionDef *fd = s->cur_func;
        int scope = fd->scope_level;
        emit_op(s, OP_leave_scope);
        emit_u16(s, scope);
        fd->scope_level = fd->scopes[scope].parent;
        fd->scope_first = get_first_lexical_var(fd, fd->scope_level);
    }
}